

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O3

int encode_image(void *image,size_t length,uint32_t width,uint32_t height,spng_color_type color_type
                ,int bit_depth)

{
  undefined8 uVar1;
  undefined8 uVar2;
  void *__ptr;
  size_t png_size;
  int local_5c;
  void *local_58;
  size_t local_50;
  undefined1 local_48 [8];
  uint32_t local_40;
  uint32_t local_3c;
  undefined8 local_38;
  
  local_38 = 0;
  local_58 = image;
  local_50 = length;
  uVar1 = spng_ctx_new(2);
  spng_set_option(uVar1,0xc,1);
  local_38 = CONCAT71(CONCAT61(local_38._2_6_,(char)color_type),(char)bit_depth);
  local_40 = width;
  local_3c = height;
  spng_set_ihdr(uVar1,&local_40);
  local_5c = spng_encode_image(uVar1,local_58,local_50,0x100,2);
  if (local_5c == 0) {
    __ptr = (void *)spng_get_png_buffer(uVar1,local_48,&local_5c);
    if (__ptr == (void *)0x0) {
      uVar2 = spng_strerror(local_5c);
      printf("spng_get_png_buffer() error: %s\n",uVar2);
    }
    free(__ptr);
  }
  else {
    uVar2 = spng_strerror(local_5c);
    printf("spng_encode_image() error: %s\n",uVar2);
  }
  spng_ctx_free(uVar1);
  return local_5c;
}

Assistant:

int encode_image(void *image, size_t length, uint32_t width, uint32_t height, enum spng_color_type color_type, int bit_depth)
{
    int fmt;
    int ret = 0;
    spng_ctx *ctx = NULL;
    struct spng_ihdr ihdr = {0}; /* zero-initialize to set valid defaults */

    /* Creating an encoder context requires a flag */
    ctx = spng_ctx_new(SPNG_CTX_ENCODER);

    /* Encode to internal buffer managed by the library */
    spng_set_option(ctx, SPNG_ENCODE_TO_BUFFER, 1);

    /* Alternatively you can set an output FILE* or stream with spng_set_png_file() or spng_set_png_stream() */

    /* Set image properties, this determines the destination image format */
    ihdr.width = width;
    ihdr.height = height;
    ihdr.color_type = color_type;
    ihdr.bit_depth = bit_depth;
    /* Valid color type, bit depth combinations: https://www.w3.org/TR/2003/REC-PNG-20031110/#table111 */

    spng_set_ihdr(ctx, &ihdr);

    /* When encoding fmt is the source format */
    /* SPNG_FMT_PNG is a special value that matches the format in ihdr */
    fmt = SPNG_FMT_PNG;

    /* SPNG_ENCODE_FINALIZE will finalize the PNG with the end-of-file marker */
    ret = spng_encode_image(ctx, image, length, fmt, SPNG_ENCODE_FINALIZE);

    if(ret)
    {
        printf("spng_encode_image() error: %s\n", spng_strerror(ret));
        goto encode_error;
    }

    size_t png_size;
    void *png_buf = NULL;

    /* Get the internal buffer of the finished PNG */
    png_buf = spng_get_png_buffer(ctx, &png_size, &ret);

    if(png_buf == NULL)
    {
        printf("spng_get_png_buffer() error: %s\n", spng_strerror(ret));
    }

    /* User owns the buffer after a successful call */
    free(png_buf);

encode_error:

    spng_ctx_free(ctx);

    return ret;
}